

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O2

EbmlElement *
libebml::EbmlElement::FindNextID
          (IOCallback *DataStream,EbmlCallbacks *ClassInfos,uint64 MaxDataSize)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  uint64 uVar5;
  uint64 uVar6;
  EbmlDummy *this;
  uint64 uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  binary PossibleId [4];
  EbmlId PossibleID;
  uint64 SizeUnknown;
  uint64 local_50;
  EbmlCallbacks *local_48;
  uint64 local_40;
  binary PossibleSize [8];
  undefined4 extraout_var_00;
  
  SizeUnknown = 0;
  uVar6 = 0;
  bVar2 = false;
  uVar5 = 0;
  uVar9 = 0;
  lVar11 = 0;
  uVar7 = 0;
  local_50 = MaxDataSize;
  local_48 = ClassInfos;
  while( true ) {
    if (bVar2) break;
    iVar3 = (*DataStream->_vptr_IOCallback[5])(DataStream);
    local_40 = CONCAT44(extraout_var,iVar3);
    lVar11 = (long)(int)(uint)lVar11;
    iVar3 = 0;
    uVar10 = 0x80;
    do {
      iVar4 = (*DataStream->_vptr_IOCallback[2])(DataStream,PossibleId + lVar11,1);
      iVar3 = iVar4 + iVar3;
      if ((int)lVar11 == iVar3) {
        return (EbmlElement *)0x0;
      }
      if (3 < lVar11) {
        return (EbmlElement *)0x0;
      }
      lVar11 = lVar11 + 1;
      uVar1 = uVar10 & PossibleId[0];
      uVar10 = uVar10 >> 1;
    } while (uVar1 == 0);
    iVar3 = (*DataStream->_vptr_IOCallback[5])(DataStream);
    uVar5 = CONCAT44(extraout_var_00,iVar3);
    uVar8 = uVar9 & 0xffffffff;
    do {
      if (7 < uVar8) {
        return (EbmlElement *)0x0;
      }
      uVar9 = uVar8 + 1;
      (*DataStream->_vptr_IOCallback[2])(DataStream,PossibleSize + uVar8,1);
      PossibleID.Value = (int)uVar8 + 1;
      uVar6 = ReadCodedSizeValue(PossibleSize,&PossibleID.Value,&SizeUnknown);
      uVar8 = uVar9;
    } while (PossibleID.Value == 0);
    bVar2 = true;
    uVar7 = local_40;
  }
  EbmlId::EbmlId(&PossibleID,PossibleId,(uint)lVar11);
  if ((local_48->GlobalId->Length == PossibleID.Length) &&
     (local_48->GlobalId->Value == PossibleID.Value)) {
    this = (EbmlDummy *)(*local_48->Create)();
  }
  else {
    this = (EbmlDummy *)operator_new(0x50,(nothrow_t *)&std::nothrow);
    if (this == (EbmlDummy *)0x0) {
      return (EbmlElement *)0x0;
    }
    EbmlDummy::EbmlDummy(this,&PossibleID);
  }
  (this->super_EbmlBinary).super_EbmlElement.SizeLength = (int)uVar9;
  (this->super_EbmlBinary).super_EbmlElement.Size = uVar6;
  iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[7])(this);
  if ((char)iVar3 != '\0') {
    if (uVar6 == SizeUnknown) {
      iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[6])(this,1);
      if ((char)iVar3 != '\0') {
LAB_00190308:
        (this->super_EbmlBinary).super_EbmlElement.ElementPosition = uVar7;
        (this->super_EbmlBinary).super_EbmlElement.SizePosition = uVar5;
        return (EbmlElement *)this;
      }
    }
    else if ((this->super_EbmlBinary).super_EbmlElement.Size <= local_50) {
      (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[6])(this,0);
      goto LAB_00190308;
    }
  }
  (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[1])(this);
  return (EbmlElement *)0x0;
}

Assistant:

EbmlElement * EbmlElement::FindNextID(IOCallback & DataStream, const EbmlCallbacks & ClassInfos, uint64 MaxDataSize)
{
  binary PossibleId[4];
  int PossibleID_Length = 0;
  binary PossibleSize[8]; // we don't support size stored in more than 64 bits
  uint32 PossibleSizeLength = 0;
  uint64 SizeUnknown = 0;
  uint64 SizeFound = 0;
  bool bElementFound = false;

  binary BitMask;
  uint64 aElementPosition = 0, aSizePosition = 0;
  while (!bElementFound) {
    // read ID
    aElementPosition = DataStream.getFilePointer();
    uint32 ReadSize = 0;
    BitMask = 1 << 7;
    while (1) {
      ReadSize += DataStream.read(&PossibleId[PossibleID_Length], 1);
      if (ReadSize == uint32(PossibleID_Length)) {
        return NULL; // no more data ?
      }
      if (++PossibleID_Length > 4) {
        return NULL; // we don't support element IDs over class D
      }
      if (PossibleId[0] & BitMask) {
        // this is the last octet of the ID
        // check wether that's the one we're looking for
/*      if (PossibleID == EBML_INFO_ID(ClassInfos)) {
          break;
        } else {
          /// \todo This element should be skipped (use a context ?)
        }*/
        bElementFound = true; /// \todo not exactly the one we're looking for
        break;
      }
      BitMask >>= 1;
    }

    // read the data size
    aSizePosition = DataStream.getFilePointer();
    uint32 _SizeLength;
    do {
      if (PossibleSizeLength >= 8)
        // Size is larger than 8 bytes
        return NULL;

      ReadSize += DataStream.read(&PossibleSize[PossibleSizeLength++], 1);
      _SizeLength = PossibleSizeLength;
      SizeFound = ReadCodedSizeValue(&PossibleSize[0], _SizeLength, SizeUnknown);
    } while (_SizeLength == 0);
  }

  EbmlElement *Result = NULL;
  EbmlId PossibleID(PossibleId, PossibleID_Length);
  if (PossibleID == EBML_INFO_ID(ClassInfos)) {
    // the element is the one expected
    Result = &EBML_INFO_CREATE(ClassInfos);
  } else {
    /// \todo find the element in the context
    Result = new (std::nothrow) EbmlDummy(PossibleID);
    if(Result == NULL)
      return NULL;
  }

  Result->SetSizeLength(PossibleSizeLength);

  Result->Size = SizeFound;

  if (!Result->ValidateSize() || (SizeFound != SizeUnknown && MaxDataSize < Result->Size)) {
    delete Result;
    return NULL;
  }

  // check if the size is not all 1s
  if (SizeFound == SizeUnknown) {
    // Size of this element is unknown
    // only possible for Master elements
    if (!Result->SetSizeInfinite()) {
      /// \todo the element is not allowed to be infinite
      delete Result;
      return NULL;
    }
  } else Result->SetSizeInfinite(false);
  Result->ElementPosition = aElementPosition;
  Result->SizePosition = aSizePosition;

  return Result;
}